

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniwindow.h
# Opt level: O1

void MainWindowDetails::Proc
               (Display *param_1,Window *param_2,XEvent e,Size2D *size,bool *isResizing)

{
  undefined8 in_RAX;
  
  switch(e.type) {
  case 4:
    switch(e.xkey.keycode) {
    case 1:
      relay[0x10] = 1;
      relay._12_4_ = 2;
      break;
    case 2:
      relay[0x11] = 1;
      relay._12_4_ = 4;
      break;
    case 3:
      relay[0x12] = 1;
      relay._12_4_ = 6;
      break;
    case 4:
      relay._8_8_ = 0x100000001;
      break;
    case 5:
      relay._8_8_ = 0x1ffffffff;
      break;
    default:
      goto switchD_0010ba55_caseD_7;
    }
    break;
  case 5:
    if (e.xkey.keycode == 3) {
      relay[0x12] = 0;
      relay._12_4_ = 7;
    }
    else if (e.xkey.keycode == 2) {
      relay[0x11] = 0;
      relay._12_4_ = 5;
    }
    else {
      if (e.xkey.keycode != 1) {
        return;
      }
      relay[0x10] = 0;
      relay._12_4_ = 3;
    }
    break;
  case 6:
    relay._0_8_ = e.xselectionrequest.property;
    relay._8_8_ = relay._8_8_ & 0xffffffff;
    break;
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
switchD_0010ba55_caseD_7:
    return;
  case 0xc:
    if (relay._40_8_ != 0) {
      (*(code *)relay._48_8_)(0x115300);
      return;
    }
    goto LAB_0010bba2;
  default:
    if (e.type != 0x16) {
      return;
    }
    if ((*(int *)param_1 == e.xexpose.count) &&
       (*(int *)(param_1 + 4) == e.xgraphicsexpose.major_code)) {
      return;
    }
    *(undefined1 *)param_2 = 1;
    std::function<void_(int,_int,_StateChange)>::operator()
              ((function<void_(int,_int,_StateChange)> *)(relay + 0x38),e.xexpose.count,
               e.xgraphicsexpose.major_code,Resized);
    return;
  }
  if (relay._136_8_ != 0) {
    (*(code *)relay._144_8_)(0x115360,relay,&switchD_0010ba55::switchdataD_00110070,in_RAX);
    return;
  }
LAB_0010bba2:
  std::__throw_bad_function_call();
}

Assistant:

static void Proc(Display* /*display*/, Window& /*handle*/, XEvent e, Size2D const& size, bool& isResizing)
	{
		switch(e.type)
		{
		case MotionNotify: relay.mouse_xy(e.xbutton.x, e.xbutton.y); break;
		case EnterNotify:  break;
		case LeaveNotify:  break;
		case ButtonPress:
		{
			switch(e.xbutton.button)
			{
			case 1: relay.mouse_left_down();   break;
			case 2: relay.mouse_middle_down(); break;
			case 3: relay.mouse_right_down();  break;
			case 4: relay.mouse_z(1);          break;
			case 5: relay.mouse_z(-1);         break;
			}
			break;
		}
		case ButtonRelease:
		{
			switch(e.xbutton.button)
			{
			case 1: relay.mouse_left_up();   break;
			case 2: relay.mouse_middle_up(); break;
			case 3: relay.mouse_right_up();  break;
				//case 4: relay.mouse_z(1);          break;//?
				//case 5: relay.mouse_z(-1)          break;//?
			}
			break;
		}
		case ResizeRequest:
		{
			//XResizeRequestEvent re = e.xresizerequest;
			//printf("RR\n");
			break;
		}
		case ConfigureRequest:
		{
			//XConfigureRequestEvent re = e.xconfigurerequest;
			//printf("CR\n");
			break;
		}
		case ConfigureNotify:
		{
			XConfigureEvent re = e.xconfigure;
			if( size.w == re.width && size.h == re.height )
			{
				//printf("CN Move %i %i\n", re.x, re.y);
				//XMoveWindow(display, handle, 0, 0);
			}//move only
			else
			{
				isResizing = true;
				//printf("CN Resize %i %i\n", re.width, re.height);
				relay.onResize(re.width, re.height, StateChange::Resized);
			}
			break;
		}
		//CM handled outside.
		case Expose: relay.onRender(); break;
		}
	}